

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMan.c
# Opt level: O3

Fraig_NodeVec_t * Fraig_ManGetSimInfo(Fraig_Man_t *p)

{
  Fraig_NodeVec_t *pFVar1;
  Fraig_Node_t **ppFVar2;
  Fraig_Node_t *pFVar3;
  Fraig_Node_t *pFVar4;
  uint *puVar5;
  int iVar6;
  int iVar7;
  Fraig_NodeVec_t *pFVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar12;
  int iVar11;
  
  iVar6 = Fraig_ManReadPatternNumRandom(p);
  iVar7 = Fraig_ManReadPatternNumDynamic(p);
  iVar11 = iVar6 + 0x1f;
  if (-1 < iVar6) {
    iVar11 = iVar6;
  }
  uVar10 = iVar11 >> 5;
  iVar11 = iVar7 + 0x1f;
  if (-1 < iVar7) {
    iVar11 = iVar7;
  }
  pFVar8 = Fraig_UtilInfoAlloc(p->vNodes->nSize,uVar10 + (iVar11 >> 5),0);
  pFVar1 = p->vNodes;
  if (0 < pFVar1->nSize) {
    ppFVar2 = pFVar1->pArray;
    uVar9 = 0;
    do {
      pFVar3 = ppFVar2[uVar9];
      if (uVar9 != (uint)pFVar3->Num) {
        __assert_fail("i == pNode->Num",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fraig/fraigMan.c"
                      ,0x1b1,"Fraig_NodeVec_t *Fraig_ManGetSimInfo(Fraig_Man_t *)");
      }
      pFVar4 = pFVar8->pArray[uVar9];
      if (0x1f < iVar6) {
        puVar5 = pFVar3->puSimR;
        uVar12 = 0;
        do {
          (&pFVar4->Num)[uVar12] = puVar5[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar10 != uVar12);
      }
      if (0x1f < iVar7) {
        puVar5 = pFVar3->puSimD;
        uVar12 = 0;
        do {
          (&pFVar4->Num)[(long)(int)uVar10 + uVar12] = puVar5[uVar12];
          uVar12 = uVar12 + 1;
        } while ((uint)(iVar11 >> 5) != uVar12);
      }
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)pFVar1->nSize);
  }
  return pFVar8;
}

Assistant:

Fraig_NodeVec_t * Fraig_ManGetSimInfo( Fraig_Man_t * p )
{
    Fraig_NodeVec_t * vInfo;
    Fraig_Node_t * pNode;
    unsigned * pUnsigned;
    int nRandom, nDynamic;
    int i, k, nWords;

    nRandom  = Fraig_ManReadPatternNumRandom( p );
    nDynamic = Fraig_ManReadPatternNumDynamic( p );
    nWords = nRandom / 32 + nDynamic / 32;

    vInfo = Fraig_UtilInfoAlloc( p->vNodes->nSize, nWords, 0 );
    for ( i = 0; i < p->vNodes->nSize; i++ )
    {
        pNode = p->vNodes->pArray[i];
        assert( i == pNode->Num );
        pUnsigned = (unsigned *)vInfo->pArray[i];
        for ( k = 0; k < nRandom / 32; k++ )
            pUnsigned[k] = pNode->puSimR[k];
        for ( k = 0; k < nDynamic / 32; k++ )
            pUnsigned[nRandom / 32 + k] = pNode->puSimD[k];
    }
    return vInfo;
}